

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O2

void __thiscall
gvr::ColoredMesh::ColoredMesh
          (ColoredMesh *this,ColoredMesh *p,vector<bool,_std::allocator<bool>_> *vused,
          vector<bool,_std::allocator<bool>_> *tused)

{
  const_reference cVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  int i;
  size_type __n;
  long lVar5;
  
  Mesh::Mesh(&this->super_Mesh,&p->super_Mesh,vused,tused);
  (this->super_Mesh).super_PointCloud.super_Model._vptr_Model =
       (_func_int **)&PTR__ColoredMesh_001319e0;
  iVar4 = (this->super_Mesh).super_PointCloud.n;
  iVar2 = -1;
  if (-1 < iVar4) {
    iVar2 = iVar4 * 3;
  }
  puVar3 = (uchar *)operator_new__((long)iVar2);
  this->rgb = puVar3;
  lVar5 = 0;
  iVar4 = 0;
  for (__n = 0; (long)__n < (long)(p->super_Mesh).super_PointCloud.n; __n = __n + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,__n);
    if (cVar1) {
      this->rgb[iVar4] = p->rgb[lVar5];
      this->rgb[(long)iVar4 + 1] = p->rgb[lVar5 + 1];
      this->rgb[(long)iVar4 + 2] = p->rgb[lVar5 + 2];
      iVar4 = iVar4 + 3;
    }
    lVar5 = lVar5 + 3;
  }
  return;
}

Assistant:

ColoredMesh::ColoredMesh(const ColoredMesh &p, const std::vector<bool> &vused,
                         const std::vector<bool> &tused) : Mesh(p, vused, tused)
{
  rgb=new unsigned char [3*getVertexCount()];

  int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      rgb[k++]=p.getColorComp(i, 0);
      rgb[k++]=p.getColorComp(i, 1);
      rgb[k++]=p.getColorComp(i, 2);
    }
  }
}